

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

int __thiscall
QDockAreaLayout::separatorMove
          (QDockAreaLayout *this,QList<int> *separator,QPoint *origin,QPoint *dest)

{
  int iVar1;
  undefined4 uVar2;
  uint *puVar3;
  qsizetype qVar4;
  QDockAreaLayoutInfo *pQVar5;
  QList<QLayoutStruct> *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *unaff_retaddr;
  Orientation o;
  int sep_index;
  QDockAreaLayoutInfo *info;
  int index;
  int delta;
  QList<QLayoutStruct> list;
  QList<QLayoutStruct> *in_stack_000000c0;
  QList<QLayoutStruct> *in_stack_000000c8;
  QDockAreaLayout *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Orientation in_stack_ffffffffffffff84;
  Orientation o_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QDockAreaLayout *in_stack_ffffffffffffff98;
  undefined1 animate;
  uint uVar6;
  QPoint *ver_struct_list;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd8;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffe0;
  long lVar7;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  ver_struct_list = in_RDI;
  puVar3 = (uint *)QList<int>::last((QList<int> *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  uVar6 = *puVar3;
  qVar4 = QList<int>::size((QList<int> *)in_RSI);
  if (qVar4 < 2) {
    QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)0x57c5dc);
    animate = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
    if ((uVar6 == 0) || (uVar6 == 1)) {
      getGrid(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
    }
    else {
      getGrid(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
    }
    uVar2 = 2;
    if (uVar6 < 2) {
      uVar2 = 1;
    }
    ::operator-((QPoint *)(ulong)CONCAT14(uVar6 != 0 && uVar6 != 2,uVar2),in_RDI);
    pick(in_stack_ffffffffffffff84,(QPoint *)CONCAT44(uVar2,in_stack_ffffffffffffff78));
    iVar1 = separatorMoveHelper(_index,info._4_4_,(int)info,sep_index);
    *(undefined1 *)&in_RDI[0x40].yp.m_i = 0;
    if ((uVar6 == 0) || (uVar6 == 1)) {
      setGrid((QDockAreaLayout *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
              (QList<QLayoutStruct> *)ver_struct_list,in_RSI);
    }
    else {
      setGrid((QDockAreaLayout *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
              (QList<QLayoutStruct> *)ver_struct_list,in_RSI);
    }
    apply((QDockAreaLayout *)CONCAT44(iVar1,uVar6),(bool)animate);
    QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x57c724);
  }
  else {
    pQVar5 = QDockAreaLayout::info
                       (in_stack_ffffffffffffff98,
                        (QList<int> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
    ;
    o_00 = pQVar5->o;
    ::operator-((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
    iVar1 = pick(o_00,(QPoint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (iVar1 != 0) {
      iVar1 = QDockAreaLayoutInfo::separatorMove
                        (in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (int)in_stack_ffffffffffffffd8);
    }
    QDockAreaLayoutInfo::apply(unaff_retaddr,SUB81((ulong)lVar7 >> 0x38,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QDockAreaLayout::separatorMove(const QList<int> &separator, const QPoint &origin,
                                                const QPoint &dest)
{
    int delta = 0;
    int index = separator.last();

    if (separator.size() > 1) {
        QDockAreaLayoutInfo *info = this->info(separator);
        delta = pick(info->o, dest - origin);
        if (delta != 0)
            delta = info->separatorMove(index, delta);
        info->apply(false);
        return delta;
    }

    QList<QLayoutStruct> list;

    if (index == QInternal::LeftDock || index == QInternal::RightDock)
        getGrid(nullptr, &list);
    else
        getGrid(&list, nullptr);

    int sep_index = index == QInternal::LeftDock || index == QInternal::TopDock
                        ? 0 : 1;
    Qt::Orientation o = index == QInternal::LeftDock || index == QInternal::RightDock
                        ? Qt::Horizontal
                        : Qt::Vertical;

    delta = pick(o, dest - origin);
    delta = separatorMoveHelper(list, sep_index, delta, sep);

    fallbackToSizeHints = false;

    if (index == QInternal::LeftDock || index == QInternal::RightDock)
        setGrid(nullptr, &list);
    else
        setGrid(&list, nullptr);

    apply(false);

    return delta;
}